

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# x_vexp.c
# Opt level: O1

ex_ex * eval_sigidx(expr *expr,ex_ex *eptr,ex_ex *optr,int idx)

{
  long lVar1;
  int iVar2;
  ex_ex *peVar3;
  t_float i;
  anon_union_8_5_735de1bb_for_ex_cont aVar4;
  undefined4 uVar5;
  t_float rem_i;
  anon_union_8_5_735de1bb_for_ex_cont local_48;
  long lStack_40;
  undefined8 local_38;
  
  local_48.v_int = 0;
  lStack_40 = 0;
  local_38 = 0;
  peVar3 = ex_eval(expr,eptr + 1,(ex_ex *)&local_48,idx);
  if (lStack_40 == 1) {
    uVar5 = (undefined4)local_48.v_int;
    aVar4 = local_48;
  }
  else {
    if (lStack_40 == 2) {
      i = (t_float)(int)local_48.v_flt;
      rem_i = local_48.v_flt - (float)(int)local_48.v_flt;
      uVar5 = local_48.v_flt;
      goto LAB_00197afd;
    }
    post("eval_sigidx: bad res type (%d)");
    uVar5 = 0.0;
    aVar4.v_int = 0;
  }
  i = aVar4.v_flt;
  rem_i = 0.0;
LAB_00197afd:
  optr->ex_type = 2;
  if (eptr->ex_type == 0x10) {
    if (0.0 <= (float)uVar5) {
      i = -NAN;
      if ((expr->exp_error & 2U) == 0) {
        expr->exp_error = expr->exp_error | 2;
        post("fexpr~: bad output index, (%f)",SUB84((double)(float)uVar5,0));
        ex_print(eptr);
        post("fexpr~: no error report till next reset");
        post("fexpr~: index assumed to be = -1");
      }
    }
    lVar1 = (eptr->ex_cont).v_int;
    if (lVar1 < expr->exp_nexpr) {
      iVar2 = cal_sigidx(optr,(int)i,rem_i,idx,expr->exp_vsize,expr->exp_tmpres[lVar1],
                         expr->exp_p_res[lVar1]);
      if ((iVar2 != 0) && ((expr->exp_error & 2U) == 0)) {
        expr->exp_error = expr->exp_error | 2;
        post("fexpr~: bad output index, (%f)",SUB84((double)(float)uVar5,0));
        ex_print(eptr);
        post("fexpr~: index assumed to be = -%d",(ulong)(uint)expr->exp_vsize);
      }
    }
    else {
      post("fexpr~: $y%d illegal: not that many exprs");
      (optr->ex_cont).v_flt = 0.0;
    }
  }
  else if (eptr->ex_type == 0x12) {
    if (0.0 < (float)uVar5) {
      if ((expr->exp_error & 4U) == 0) {
        expr->exp_error = expr->exp_error | 4;
        post("expr: input vector index > 0, (vector x%d[%f])",
             SUB84((double)(rem_i + (float)(int)i),0),(eptr->ex_cont).v_int + 1);
        i = 0.0;
        post("fexpr~: index assumed to be = 0");
        post("fexpr~: no error report till next reset");
        ex_print(eptr);
        rem_i = 0.0;
      }
      else {
        i = 0.0;
        rem_i = 0.0;
      }
    }
    iVar2 = cal_sigidx(optr,(int)i,rem_i,idx,expr->exp_vsize,
                       expr->exp_var[(eptr->ex_cont).v_int].ex_cont.v_vec,
                       expr->exp_p_var[(eptr->ex_cont).v_int]);
    if ((iVar2 != 0) && ((expr->exp_error & 4U) == 0)) {
      expr->exp_error = expr->exp_error | 4;
      post("expr: input vector index <  -VectorSize, (vector x%d[%f])",SUB84((double)(float)uVar5,0)
           ,(eptr->ex_cont).v_int + 1);
      ex_print(eptr);
      post("fexpr~: index assumed to be = -%d",(ulong)(uint)expr->exp_vsize);
      post("fexpr~: no error report till next reset");
    }
  }
  else {
    (optr->ex_cont).v_flt = 0.0;
    post("fexpr~:eval_sigidx: internal error - unknown vector (%d)",eptr->ex_type);
  }
  return peVar3;
}

Assistant:

struct ex_ex *
eval_sigidx(struct expr *expr, struct ex_ex *eptr, struct ex_ex *optr, int idx)
/* the expr object data pointer */
/* the operation stack */
/* the result pointer */
/* the index */
{
        struct ex_ex arg = { 0 };
        struct ex_ex *reteptr;
        int i = 0;
        t_float fi = 0,         /* index in float */
              rem_i = 0;        /* remains of the float */

        arg.ex_type = 0;
        arg.ex_int = 0;
        reteptr = ex_eval(expr, eptr + 1, &arg, idx);
        if (arg.ex_type == ET_FLT) {
                fi = arg.ex_flt;                /* float index */
                i = (int) arg.ex_flt;           /* integer index */
                rem_i =  arg.ex_flt - i;        /* remains of integer */
        } else if (arg.ex_type == ET_INT) {
                fi = arg.ex_int;                /* float index */
                i = (int) arg.ex_int;           /* integer index */
                rem_i = 0;
        } else {
                post("eval_sigidx: bad res type (%d)", arg.ex_type);
        }
        optr->ex_type = ET_FLT;
        /*
         * indexing an input vector
         */
        if (eptr->ex_type == ET_XI) {
                if (fi > 0) {
                        if (!(expr->exp_error & EE_BI_INPUT)) {
                                expr->exp_error |= EE_BI_INPUT;
                          post("expr: input vector index > 0, (vector x%d[%f])",
                                               eptr->ex_int + 1, i + rem_i);
                                post("fexpr~: index assumed to be = 0");
                                post("fexpr~: no error report till next reset");
                                ex_print(eptr);
                        }
                        /* just replace it with zero */
                        i = 0;
                        rem_i = 0;
                }
                if (cal_sigidx(optr, i, rem_i, idx, expr->exp_vsize,
                                        expr->exp_var[eptr->ex_int].ex_vec,
                                                expr->exp_p_var[eptr->ex_int])) {
                        if (!(expr->exp_error & EE_BI_INPUT)) {
                                expr->exp_error |= EE_BI_INPUT;
                                post("expr: input vector index <  -VectorSize, (vector x%d[%f])", eptr->ex_int + 1, fi);
                                ex_print(eptr);
                                post("fexpr~: index assumed to be = -%d",
                                        expr->exp_vsize);
                                post("fexpr~: no error report till next reset");
                        }
                }

        /*
         * indexing an output vector
         */
        } else if (eptr->ex_type == ET_YO) {
                /* for output vectors index of zero is not legal */
                if (fi >= 0) {
                        if (!(expr->exp_error & EE_BI_OUTPUT)) {
                                expr->exp_error |= EE_BI_OUTPUT;
                                post("fexpr~: bad output index, (%f)", fi);
                                ex_print(eptr);
                                post("fexpr~: no error report till next reset");
                                post("fexpr~: index assumed to be = -1");
                        }
                        i = -1;
                }
                if (eptr->ex_int >= expr->exp_nexpr) {
                        post("fexpr~: $y%d illegal: not that many exprs",
                                                                eptr->ex_int);
                        optr->ex_flt = 0;
                        return (reteptr);
                }
                if (cal_sigidx(optr, i, rem_i, idx, expr->exp_vsize,
                             expr->exp_tmpres[eptr->ex_int],
                                                expr->exp_p_res[eptr->ex_int])) {
                        if (!(expr->exp_error & EE_BI_OUTPUT)) {
                                expr->exp_error |= EE_BI_OUTPUT;
                                post("fexpr~: bad output index, (%f)", fi);
                                ex_print(eptr);
                                post("fexpr~: index assumed to be = -%d",
                                        expr->exp_vsize);
                        }
                }
        } else {
                optr->ex_flt = 0;
                post("fexpr~:eval_sigidx: internal error - unknown vector (%d)",
                                                                eptr->ex_type);
        }
        return (reteptr);
}